

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  float fVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  int64_t iVar4;
  float *pfVar5;
  AlignedVector<float> *in_RSI;
  AlignedVector<float> *in_RDI;
  uint in_XMM0_Da;
  int64_t i;
  size_t local_20;
  
  iVar3 = size((Vector *)0x1c3fa3);
  iVar4 = size((Vector *)0x1c3fb2);
  if (iVar3 == iVar4) {
    local_20 = 0;
    while( true ) {
      iVar3 = size((Vector *)0x1c3ffd);
      if (iVar3 <= (long)local_20) break;
      pfVar5 = intgemm::AlignedVector<float>::operator[](in_RSI,local_20);
      fVar1 = *pfVar5;
      pfVar5 = intgemm::AlignedVector<float>::operator[](in_RDI,local_20);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416(in_XMM0_Da),ZEXT416((uint)*pfVar5));
      *pfVar5 = auVar2._0_4_;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}